

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaParser::ExtractDataObjectFromChannel
          (ColladaParser *this,InputChannel *pInput,size_t pLocalIndex,Mesh *pMesh)

{
  InputType IVar1;
  size_t sVar2;
  pointer pfVar3;
  size_t sVar4;
  const_iterator __position;
  const_iterator cVar5;
  ulong uVar6;
  Logger *this_00;
  ostream *poVar7;
  ulong uVar8;
  long lVar9;
  char *message;
  int iVar10;
  ai_real *paVar11;
  vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *this_01;
  Accessor *s;
  undefined1 local_1c8 [8];
  undefined8 uStack_1c0;
  ai_real obj [4];
  
  IVar1 = pInput->mType;
  if (IVar1 == IT_Vertex) {
    return;
  }
  s = pInput->mResolved;
  if (s->mCount <= pLocalIndex) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)obj);
    std::operator<<((ostream *)obj,"Invalid data index (");
    std::ostream::_M_insert<unsigned_long>((ulong)obj);
    std::operator<<((ostream *)obj,"/");
    poVar7 = (ostream *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)obj,
                        &s->mCount);
    std::operator<<(poVar7,") in primitive specification");
    std::__cxx11::stringbuf::str();
    ThrowException(this,(string *)local_1c8);
  }
  sVar2 = s->mOffset;
  pfVar3 = (s->mData->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar4 = s->mStride;
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    obj[lVar9] = pfVar3[sVar2 + pLocalIndex * sVar4 + s->mSubOffset[lVar9]];
  }
  switch(IVar1) {
  case IT_Position:
    if (pInput->mIndex == 0) {
      this_01 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&pMesh->mPositions;
LAB_003ed014:
      local_1c8._0_4_ = obj[0];
      local_1c8._4_4_ = obj[1];
      uStack_1c0 = CONCAT44(uStack_1c0._4_4_,obj[2]);
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      emplace_back<aiVector3t<float>>(this_01,(aiVector3t<float> *)local_1c8);
      return;
    }
    this_00 = DefaultLogger::get();
    message = "Collada: just one vertex position stream supported";
    break;
  case IT_Normal:
    cVar5._M_current =
         (pMesh->mNormals).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    uVar6 = ((long)cVar5._M_current -
            (long)(pMesh->mNormals).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start) / 0xc;
    this_01 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&pMesh->mNormals;
    lVar9 = ((long)(pMesh->mPositions).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)(pMesh->mPositions).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start) / 0xc;
    if (uVar6 < lVar9 - 1U) {
      local_1c8 = (undefined1  [8])0x3f80000000000000;
      uStack_1c0 = (ulong)(uint)uStack_1c0._4_4_ << 0x20;
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::insert
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this_01,cVar5,
                 lVar9 + ~uVar6,(value_type *)local_1c8);
    }
    if (pInput->mIndex == 0) goto LAB_003ed014;
    this_00 = DefaultLogger::get();
    message = "Collada: just one vertex normal stream supported";
    break;
  case IT_Texcoord:
    uVar6 = pInput->mIndex;
    if (uVar6 < 8) {
      cVar5._M_current =
           pMesh->mTexCoords[uVar6].
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      uVar8 = ((long)cVar5._M_current -
              (long)pMesh->mTexCoords[uVar6].
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0xc;
      lVar9 = ((long)(pMesh->mPositions).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(pMesh->mPositions).
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0xc;
      if (uVar8 < lVar9 - 1U) {
        local_1c8 = (undefined1  [8])0x0;
        uStack_1c0 = (ulong)(uint)uStack_1c0._4_4_ << 0x20;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::insert
                  (pMesh->mTexCoords + uVar6,cVar5,lVar9 + ~uVar8,(value_type *)local_1c8);
        uVar6 = pInput->mIndex;
      }
      local_1c8._0_4_ = obj[0];
      local_1c8._4_4_ = obj[1];
      uStack_1c0 = CONCAT44(uStack_1c0._4_4_,obj[2]);
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      emplace_back<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)
                 (pMesh->mTexCoords + uVar6),(aiVector3t<float> *)local_1c8);
      if ((s->mSubOffset[2] == 0) && (s->mSubOffset[3] == 0)) {
        return;
      }
      pMesh->mNumUVComponents[pInput->mIndex] = 3;
      return;
    }
    this_00 = DefaultLogger::get();
    message = "Collada: too many texture coordinate sets. Skipping.";
    break;
  case IT_Color:
    uVar6 = pInput->mIndex;
    if (uVar6 < 8) {
      __position._M_current =
           pMesh->mColors[uVar6].
           super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      uVar8 = (long)__position._M_current -
              (long)pMesh->mColors[uVar6].
                    super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
                    .super__Vector_impl_data._M_start >> 4;
      lVar9 = ((long)(pMesh->mPositions).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(pMesh->mPositions).
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0xc;
      if (uVar8 < lVar9 - 1U) {
        local_1c8 = (undefined1  [8])0x0;
        uStack_1c0 = 0x3f80000000000000;
        std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::insert
                  (pMesh->mColors + uVar6,__position,lVar9 + ~uVar8,(value_type *)local_1c8);
        s = pInput->mResolved;
      }
      local_1c8 = (undefined1  [8])0x0;
      uStack_1c0 = 0x3f80000000000000;
      uVar6 = s->mSize;
      for (uVar8 = 0; uVar8 < uVar6; uVar8 = uVar8 + 1) {
        iVar10 = (int)uVar8;
        paVar11 = (ai_real *)((long)&uStack_1c0 + 4);
        if (((iVar10 != 3) && (paVar11 = (ai_real *)&uStack_1c0, iVar10 != 2)) &&
           (paVar11 = (ai_real *)local_1c8, iVar10 == 1)) {
          paVar11 = (ai_real *)(local_1c8 + 4);
        }
        *paVar11 = obj[s->mSubOffset[uVar8]];
      }
      std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
                (pMesh->mColors + pInput->mIndex,(value_type *)local_1c8);
      return;
    }
    this_00 = DefaultLogger::get();
    message = "Collada: too many vertex color sets. Skipping.";
    break;
  case IT_Tangent:
    cVar5._M_current =
         (pMesh->mTangents).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    uVar6 = ((long)cVar5._M_current -
            (long)(pMesh->mTangents).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start) / 0xc;
    this_01 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&pMesh->mTangents;
    lVar9 = ((long)(pMesh->mPositions).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)(pMesh->mPositions).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start) / 0xc;
    if (uVar6 < lVar9 - 1U) {
      local_1c8 = (undefined1  [8])0x3f800000;
      uStack_1c0 = (ulong)(uint)uStack_1c0._4_4_ << 0x20;
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::insert
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this_01,cVar5,
                 lVar9 + ~uVar6,(value_type *)local_1c8);
    }
    if (pInput->mIndex == 0) goto LAB_003ed014;
    this_00 = DefaultLogger::get();
    message = "Collada: just one vertex tangent stream supported";
    break;
  case IT_Bitangent:
    cVar5._M_current =
         (pMesh->mBitangents).
         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    uVar6 = ((long)cVar5._M_current -
            (long)(pMesh->mBitangents).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start) / 0xc;
    this_01 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&pMesh->mBitangents;
    lVar9 = ((long)(pMesh->mPositions).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)(pMesh->mPositions).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start) / 0xc;
    if (uVar6 < lVar9 - 1U) {
      local_1c8 = (undefined1  [8])0x0;
      uStack_1c0 = CONCAT44(uStack_1c0._4_4_,0x3f800000);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::insert
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this_01,cVar5,
                 lVar9 + ~uVar6,(value_type *)local_1c8);
    }
    if (pInput->mIndex == 0) goto LAB_003ed014;
    this_00 = DefaultLogger::get();
    message = "Collada: just one vertex bitangent stream supported";
    break;
  default:
    __assert_fail("false && \"shouldn\'t ever get here\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaParser.cpp"
                  ,0xae7,
                  "void Assimp::ColladaParser::ExtractDataObjectFromChannel(const InputChannel &, size_t, Mesh *)"
                 );
  }
  Logger::error(this_00,message);
  return;
}

Assistant:

void ColladaParser::ExtractDataObjectFromChannel(const InputChannel& pInput, size_t pLocalIndex, Mesh* pMesh)
{
    // ignore vertex referrer - we handle them that separate
    if (pInput.mType == IT_Vertex)
        return;

    const Accessor& acc = *pInput.mResolved;
    if (pLocalIndex >= acc.mCount)
        ThrowException(format() << "Invalid data index (" << pLocalIndex << "/" << acc.mCount << ") in primitive specification");

    // get a pointer to the start of the data object referred to by the accessor and the local index
    const ai_real* dataObject = &(acc.mData->mValues[0]) + acc.mOffset + pLocalIndex * acc.mStride;

    // assemble according to the accessors component sub-offset list. We don't care, yet,
    // what kind of object exactly we're extracting here
    ai_real obj[4];
    for (size_t c = 0; c < 4; ++c)
        obj[c] = dataObject[acc.mSubOffset[c]];

    // now we reinterpret it according to the type we're reading here
    switch (pInput.mType)
    {
    case IT_Position: // ignore all position streams except 0 - there can be only one position
        if (pInput.mIndex == 0)
            pMesh->mPositions.push_back(aiVector3D(obj[0], obj[1], obj[2]));
        else
            ASSIMP_LOG_ERROR("Collada: just one vertex position stream supported");
        break;
    case IT_Normal:
        // pad to current vertex count if necessary
        if (pMesh->mNormals.size() < pMesh->mPositions.size() - 1)
            pMesh->mNormals.insert(pMesh->mNormals.end(), pMesh->mPositions.size() - pMesh->mNormals.size() - 1, aiVector3D(0, 1, 0));

        // ignore all normal streams except 0 - there can be only one normal
        if (pInput.mIndex == 0)
            pMesh->mNormals.push_back(aiVector3D(obj[0], obj[1], obj[2]));
        else
            ASSIMP_LOG_ERROR("Collada: just one vertex normal stream supported");
        break;
    case IT_Tangent:
        // pad to current vertex count if necessary
        if (pMesh->mTangents.size() < pMesh->mPositions.size() - 1)
            pMesh->mTangents.insert(pMesh->mTangents.end(), pMesh->mPositions.size() - pMesh->mTangents.size() - 1, aiVector3D(1, 0, 0));

        // ignore all tangent streams except 0 - there can be only one tangent
        if (pInput.mIndex == 0)
            pMesh->mTangents.push_back(aiVector3D(obj[0], obj[1], obj[2]));
        else
            ASSIMP_LOG_ERROR("Collada: just one vertex tangent stream supported");
        break;
    case IT_Bitangent:
        // pad to current vertex count if necessary
        if (pMesh->mBitangents.size() < pMesh->mPositions.size() - 1)
            pMesh->mBitangents.insert(pMesh->mBitangents.end(), pMesh->mPositions.size() - pMesh->mBitangents.size() - 1, aiVector3D(0, 0, 1));

        // ignore all bitangent streams except 0 - there can be only one bitangent
        if (pInput.mIndex == 0)
            pMesh->mBitangents.push_back(aiVector3D(obj[0], obj[1], obj[2]));
        else
            ASSIMP_LOG_ERROR("Collada: just one vertex bitangent stream supported");
        break;
    case IT_Texcoord:
        // up to 4 texture coord sets are fine, ignore the others
        if (pInput.mIndex < AI_MAX_NUMBER_OF_TEXTURECOORDS)
        {
            // pad to current vertex count if necessary
            if (pMesh->mTexCoords[pInput.mIndex].size() < pMesh->mPositions.size() - 1)
                pMesh->mTexCoords[pInput.mIndex].insert(pMesh->mTexCoords[pInput.mIndex].end(),
                    pMesh->mPositions.size() - pMesh->mTexCoords[pInput.mIndex].size() - 1, aiVector3D(0, 0, 0));

            pMesh->mTexCoords[pInput.mIndex].push_back(aiVector3D(obj[0], obj[1], obj[2]));
            if (0 != acc.mSubOffset[2] || 0 != acc.mSubOffset[3]) /* hack ... consider cleaner solution */
                pMesh->mNumUVComponents[pInput.mIndex] = 3;
        }
        else
        {
            ASSIMP_LOG_ERROR("Collada: too many texture coordinate sets. Skipping.");
        }
        break;
    case IT_Color:
        // up to 4 color sets are fine, ignore the others
        if (pInput.mIndex < AI_MAX_NUMBER_OF_COLOR_SETS)
        {
            // pad to current vertex count if necessary
            if (pMesh->mColors[pInput.mIndex].size() < pMesh->mPositions.size() - 1)
                pMesh->mColors[pInput.mIndex].insert(pMesh->mColors[pInput.mIndex].end(),
                    pMesh->mPositions.size() - pMesh->mColors[pInput.mIndex].size() - 1, aiColor4D(0, 0, 0, 1));

            aiColor4D result(0, 0, 0, 1);
            for (size_t i = 0; i < pInput.mResolved->mSize; ++i)
            {
                result[static_cast<unsigned int>(i)] = obj[pInput.mResolved->mSubOffset[i]];
            }
            pMesh->mColors[pInput.mIndex].push_back(result);
        }
        else
        {
            ASSIMP_LOG_ERROR("Collada: too many vertex color sets. Skipping.");
        }

        break;
    default:
        // IT_Invalid and IT_Vertex
        ai_assert(false && "shouldn't ever get here");
    }
}